

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n_pca.cpp
# Opt level: O2

void __thiscall n_pca::NPca::readData(NPca *this,string *data_path)

{
  NConfig *pNVar1;
  pointer pcVar2;
  size_type sVar3;
  long lVar4;
  pointer __lhs;
  char cVar5;
  bool bVar6;
  int iVar7;
  istream *piVar8;
  double *pdVar9;
  int j;
  ulong uVar10;
  int i;
  ulong uVar11;
  long lVar12;
  vector<double,_std::allocator<double>_> *this_00;
  undefined8 *puVar13;
  long lVar14;
  int i_2;
  long lVar15;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  vector<double,_std::allocator<double>_> mean_vector;
  vector<double,_std::allocator<double>_> values_vector;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  double local_280;
  MatrixXd *local_278;
  MatrixXd *local_270;
  MatrixXd *local_268;
  vector<int,_std::allocator<int>_> *local_260;
  string input_str;
  ifstream file;
  
  if (data_path->_M_string_length == 0) {
    puts("couldn\'t find data_path");
    return;
  }
  std::ifstream::ifstream(&file,(data_path->_M_dataplus)._M_p,_S_in);
  cVar5 = std::__basic_file<char>::is_open();
  if (cVar5 == '\0') {
    printf("couldn\'t open data_path: %s\n",(data_path->_M_dataplus)._M_p);
  }
  else {
    input_str._M_dataplus._M_p = (pointer)&input_str.field_2;
    input_str._M_string_length = 0;
    input_str.field_2._M_local_buf[0] = '\0';
    local_278 = &this->basic_matrix_;
    local_270 = &this->train_data_matrix_;
    local_260 = &this->train_label_;
    local_268 = &this->train_mean_;
    while (piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)&file,(string *)&input_str),
          ((byte)piVar8[*(long *)(*(long *)piVar8 + -0x18) + 0x20] & 5) == 0) {
      NConfig::n_split(&tokens,this->n_config_,&input_str,':');
      bVar6 = std::operator==(tokens.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,"dimension");
      __lhs = tokens.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      if (bVar6) {
        iVar7 = atoi(tokens.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
        this->n_config_->dimension_ = iVar7;
      }
      bVar6 = std::operator==(__lhs,"image_width");
      if (bVar6) {
        iVar7 = atoi(tokens.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
        this->n_config_->image_width_ = iVar7;
      }
      else {
        bVar6 = std::operator==(tokens.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,"image_height");
        if (bVar6) {
          iVar7 = atoi(tokens.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
          this->n_config_->image_height_ = iVar7;
        }
        else {
          bVar6 = std::operator==(tokens.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,"train_mean");
          if (bVar6) {
            NConfig::n_split(&values,this->n_config_,&input_str,' ');
            mean_vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            mean_vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            mean_vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            lVar15 = 0x20;
            for (uVar11 = 1;
                uVar11 < (ulong)((long)values.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)values.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5);
                uVar11 = uVar11 + 1) {
              bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&((values.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 _M_dataplus)._M_p + lVar15),"");
              if (!bVar6) {
                values_vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)atof(*(char **)((long)&((values.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar15));
                std::vector<double,_std::allocator<double>_>::emplace_back<double>
                          (&mean_vector,(double *)&values_vector);
              }
              lVar15 = lVar15 + 0x20;
            }
            Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
                      ((ConstantReturnType *)&values_vector,1,
                       (long)mean_vector.super__Vector_base<double,_std::allocator<double>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                       (long)mean_vector.super__Vector_base<double,_std::allocator<double>_>._M_impl
                             .super__Vector_impl_data._M_start >> 3);
            Eigen::internal::
            call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                      (local_268,(ConstantReturnType *)&values_vector);
            pdVar9 = (this->train_mean_).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_data;
            lVar15 = (this->train_mean_).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_rows;
            for (lVar12 = 0;
                (long)mean_vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)mean_vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3 != lVar12; lVar12 = lVar12 + 1) {
              *pdVar9 = mean_vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar12];
              pdVar9 = pdVar9 + lVar15;
            }
            std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                      (&mean_vector.super__Vector_base<double,_std::allocator<double>_>);
            this_00 = (vector<double,_std::allocator<double>_> *)&values;
          }
          else {
            bVar6 = std::operator==(tokens.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,"train_label");
            if (bVar6) {
              NConfig::n_split(&values,this->n_config_,&input_str,' ');
              lVar15 = 0;
              for (uVar11 = 0; this_00 = (vector<double,_std::allocator<double>_> *)&values,
                  uVar11 < (ulong)((long)values.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)values.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 5);
                  uVar11 = uVar11 + 1) {
                bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)&((values.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar15),"");
                if (!bVar6) {
                  iVar7 = atoi(*(char **)((long)&((values.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                 _M_dataplus)._M_p + lVar15));
                  mean_vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start =
                       (pointer)CONCAT44(mean_vector.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start._4_4_,iVar7);
                  std::vector<int,_std::allocator<int>_>::emplace_back<int>
                            (local_260,(int *)&mean_vector);
                }
                lVar15 = lVar15 + 0x20;
              }
            }
            else {
              bVar6 = std::operator==(tokens.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start,"train_data_matrix")
              ;
              if (bVar6) {
                pNVar1 = this->n_config_;
                std::__cxx11::string::string
                          ((string *)&values,
                           tokens.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,
                           (allocator *)&values_vector);
                NConfig::n_split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&mean_vector,pNVar1,(string *)&values,',');
                std::__cxx11::string::~string((string *)&values);
                values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                for (uVar11 = 0;
                    uVar11 < (ulong)((long)mean_vector.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                     (long)mean_vector.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start >> 5);
                    uVar11 = uVar11 + 1) {
                  values_vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  values_vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  values_vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  NConfig::n_split(&values_2,this->n_config_,
                                   (string *)
                                   (mean_vector.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start + uVar11 * 4),' ');
                  lVar15 = 0;
                  for (uVar10 = 0;
                      uVar10 < (ulong)((long)values_2.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)values_2.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 5);
                      uVar10 = uVar10 + 1) {
                    bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)((long)&((values_2.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar15),"");
                    if (!bVar6) {
                      local_280 = atof(*(char **)((long)&((values_2.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar15));
                      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                                (&values_vector,&local_280);
                    }
                    lVar15 = lVar15 + 0x20;
                  }
                  if (values_vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish !=
                      values_vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start) {
                    std::
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 *)&values,(value_type *)&values_vector);
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&values_2);
                  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                            ((_Vector_base<double,_std::allocator<double>_> *)&values_vector);
                }
                Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
                          ((ConstantReturnType *)&values_vector,
                           ((long)values.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)values.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x18,
                           (long)((values.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_string_length -
                                 (long)((values.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p) >> 3);
                Eigen::internal::
                call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                          (local_270,(ConstantReturnType *)&values_vector);
                lVar15 = 0;
                for (lVar12 = 0;
                    lVar12 != ((long)values.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)values.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x18;
                    lVar12 = lVar12 + 1) {
                  pcVar2 = (&(values.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)[lVar12 * 3].
                           _M_p;
                  sVar3 = (&(values.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_string_length)
                          [lVar12 * 3];
                  lVar4 = (this->train_data_matrix_).
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                          .m_rows;
                  puVar13 = (undefined8 *)
                            ((long)(this->train_data_matrix_).
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                   m_storage.m_data + lVar15);
                  for (lVar14 = 0; (long)(sVar3 - (long)pcVar2) >> 3 != lVar14; lVar14 = lVar14 + 1)
                  {
                    *puVar13 = *(undefined8 *)(pcVar2 + lVar14 * 8);
                    puVar13 = puVar13 + lVar4;
                  }
                  lVar15 = lVar15 + 8;
                }
              }
              else {
                bVar6 = std::operator==(tokens.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start,"basic_matrix");
                if (!bVar6) goto LAB_00104f49;
                pNVar1 = this->n_config_;
                std::__cxx11::string::string
                          ((string *)&values,
                           tokens.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p,
                           (allocator *)&values_vector);
                NConfig::n_split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&mean_vector,pNVar1,(string *)&values,',');
                std::__cxx11::string::~string((string *)&values);
                values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                values.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                for (uVar11 = 0;
                    uVar11 < (ulong)((long)mean_vector.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                     (long)mean_vector.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start >> 5);
                    uVar11 = uVar11 + 1) {
                  values_vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  values_vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  values_vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  NConfig::n_split(&values_2,this->n_config_,
                                   (string *)
                                   (mean_vector.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start + uVar11 * 4),' ');
                  lVar15 = 0;
                  for (uVar10 = 0;
                      uVar10 < (ulong)((long)values_2.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)values_2.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 5);
                      uVar10 = uVar10 + 1) {
                    bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)((long)&((values_2.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar15),"");
                    if (!bVar6) {
                      local_280 = atof(*(char **)((long)&((values_2.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar15));
                      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                                (&values_vector,&local_280);
                    }
                    lVar15 = lVar15 + 0x20;
                  }
                  if (values_vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish !=
                      values_vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start) {
                    std::
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 *)&values,(value_type *)&values_vector);
                  }
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&values_2);
                  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                            ((_Vector_base<double,_std::allocator<double>_> *)&values_vector);
                }
                Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
                          ((ConstantReturnType *)&values_vector,
                           ((long)values.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)values.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x18,
                           (long)((values.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_string_length -
                                 (long)((values.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p) >> 3);
                Eigen::internal::
                call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
                          (local_278,(ConstantReturnType *)&values_vector);
                lVar15 = 0;
                for (lVar12 = 0;
                    lVar12 != ((long)values.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)values.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x18;
                    lVar12 = lVar12 + 1) {
                  pcVar2 = (&(values.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)[lVar12 * 3].
                           _M_p;
                  sVar3 = (&(values.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_string_length)
                          [lVar12 * 3];
                  lVar4 = (this->basic_matrix_).
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                          .m_rows;
                  puVar13 = (undefined8 *)
                            ((long)(this->basic_matrix_).
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                   m_storage.m_data + lVar15);
                  for (lVar14 = 0; (long)(sVar3 - (long)pcVar2) >> 3 != lVar14; lVar14 = lVar14 + 1)
                  {
                    *puVar13 = *(undefined8 *)(pcVar2 + lVar14 * 8);
                    puVar13 = puVar13 + lVar4;
                  }
                  lVar15 = lVar15 + 8;
                }
              }
              std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)&values);
              this_00 = &mean_vector;
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this_00);
        }
      }
LAB_00104f49:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&tokens);
    }
    std::__cxx11::string::~string((string *)&input_str);
  }
  std::ifstream::~ifstream(&file);
  return;
}

Assistant:

void NPca::readData(const string data_path)
{
    if (data_path.length() <= 0)
    {
        printf("couldn't find data_path\n");
        return;
    }

    ifstream file(data_path.c_str());

    if (!file.is_open())
    {
        printf("couldn't open data_path: %s\n", data_path.c_str());
        return;
    }

    string input_str;
    while(getline(file, input_str))
    {
        vector<string> tokens = n_config_->n_split(input_str, ':');

        // set value
        if (tokens[0] == "dimension")
        {
            n_config_->dimension_ = atoi(tokens[1].c_str());
        }
        if (tokens[0] == "image_width")
        {
            n_config_->image_width_ = atoi(tokens[1].c_str());
        }
        else if (tokens[0] == "image_height")
        {
            n_config_->image_height_ = atoi(tokens[1].c_str());
        }
        else if (tokens[0] == "train_mean")
        {
            vector<string> values = n_config_->n_split(input_str, ' ');
            vector<double> mean_vector;
            for (int i = 1; i < values.size(); i++)
            {
                if (values[i] == "")
                {
                    continue;
                }
                mean_vector.push_back(atof(values[i].c_str()));
            }

            train_mean_ = MatrixXd::Zero(1, mean_vector.size());

            for (int i = 0; i < mean_vector.size(); i++)
                train_mean_.coeffRef(0, i) = mean_vector[i];
        }
        else if (tokens[0] == "train_label")
        {
            vector<string> values = n_config_->n_split(input_str, ' ');
            for (int i = 0; i < values.size(); i++)
            {
                if (values[i] == "")
                    continue;

                train_label_.push_back(atoi(values[i].c_str()));
            }
        }
        else if (tokens[0] == "train_data_matrix")
        {
            vector<string> row = n_config_->n_split(tokens[1].c_str(), ',');
            vector<vector<double> > train_data_vector;
            for (int i = 0; i < row.size(); i++)
            {
                vector<double> values_vector;
                vector<string> values = n_config_->n_split(row[i], ' ');
                for (int j = 0; j < values.size(); j++)
                {
                    if (values[j] == "")
                    {
                        continue;
                    }
                    values_vector.push_back(atof(values[j].c_str()));
                }
                if (values_vector.size() > 0)
                    train_data_vector.push_back(values_vector);
            }

            train_data_matrix_ = MatrixXd::Zero(train_data_vector.size(), train_data_vector[0].size());

            for (int i = 0; i < train_data_vector.size(); i++)
            {
                for (int j = 0; j < train_data_vector[i].size(); j++)
                {
                    train_data_matrix_.coeffRef(i, j) = train_data_vector[i][j];
                }
            }
        }
        else if (tokens[0] == "basic_matrix")
        {
            vector<string> row = n_config_->n_split(tokens[1].c_str(), ',');
            vector<vector<double> > basic_vector;
            for (int i = 0; i < row.size(); i++)
            {
                vector<double> values_vector;
                vector<string> values = n_config_->n_split(row[i], ' ');
                for (int j = 0; j < values.size(); j++)
                {
                    if (values[j] == "")
                    {
                        continue;
                    }
                    values_vector.push_back(atof(values[j].c_str()));  
                }
                if (values_vector.size() > 0)
                    basic_vector.push_back(values_vector);
            }

            basic_matrix_ = MatrixXd::Zero(basic_vector.size(), basic_vector[0].size());

            for (int i = 0; i < basic_vector.size(); i++)
            {
                for (int j = 0; j < basic_vector[i].size(); j++)
                {
                    basic_matrix_.coeffRef(i, j) = basic_vector[i][j];
                }
            }
        }
    }

}